

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

string * __thiscall
cmComputeLinkInformation::NoCaseExpression
          (string *__return_storage_ptr__,cmComputeLinkInformation *this,string *str)

{
  pointer pcVar1;
  size_type sVar2;
  char cVar3;
  size_type sVar4;
  int __c;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pcVar1 = (str->_M_dataplus)._M_p;
  sVar2 = str->_M_string_length;
  for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
    __c = (int)pcVar1[sVar4];
    cVar3 = (char)__return_storage_ptr__;
    if (__c != 0x2e) {
      std::__cxx11::string::push_back(cVar3);
      tolower(__c);
      std::__cxx11::string::push_back(cVar3);
      toupper(__c);
      std::__cxx11::string::push_back(cVar3);
    }
    std::__cxx11::string::push_back(cVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmComputeLinkInformation::NoCaseExpression(std::string const& str)
{
  std::string ret;
  ret.reserve(str.size() * 4);
  for (char c : str) {
    if (c == '.') {
      ret += c;
    } else {
      ret += '[';
      ret += static_cast<char>(tolower(c));
      ret += static_cast<char>(toupper(c));
      ret += ']';
    }
  }
  return ret;
}